

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

wchar_t menu_add_options(nh_menuitem **items,int *size,int *icount,wchar_t listid,
                        nh_option_desc *options,nh_bool read_only)

{
  nh_menuitem *pnVar1;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  char optbuf [256];
  wchar_t local_38;
  wchar_t id;
  wchar_t i;
  nh_bool read_only_local;
  nh_option_desc *options_local;
  wchar_t listid_local;
  int *icount_local;
  int *size_local;
  nh_menuitem **items_local;
  
  local_38 = L'\0';
  while (options[local_38].name != (char *)0x0) {
    print_option_string(options + local_38,(char *)&_item_);
    if (read_only == '\0') {
      if (*size <= *icount) {
        *size = *size << 1;
        pnVar1 = (nh_menuitem *)realloc(*items,(long)*size * 0x10c);
        *items = pnVar1;
      }
      pnVar1 = *items + *icount;
      pnVar1->id = listid << 10 | local_38;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,(char *)&_item_);
      *icount = *icount + 1;
    }
    else {
      if (*size <= *icount) {
        *size = *size << 1;
        pnVar1 = (nh_menuitem *)realloc(*items,(long)*size * 0x10c);
        *items = pnVar1;
      }
      pnVar1 = *items + *icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,(char *)&_item_);
      *icount = *icount + 1;
    }
    local_38 = local_38 + L'\x01';
  }
  if (*size <= *icount) {
    *size = *size << 1;
    pnVar1 = (nh_menuitem *)realloc(*items,(long)*size * 0x10c);
    *items = pnVar1;
  }
  pnVar1 = *items + *icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,"");
  *icount = *icount + 1;
  return local_38;
}

Assistant:

static int menu_add_options(struct nh_menuitem **items, int *size, int *icount,
	    int listid, struct nh_option_desc *options, nh_bool read_only)
{
    int i, id;
    char optbuf[256];
    
    for (i = 0; options[i].name; i++) {
	id = (listid << 10) | i;
	print_option_string(&options[i], optbuf);
	if (read_only)
	    add_menu_txt(*items, *size, *icount, optbuf, MI_TEXT);
	else
	    add_menu_item(*items, *size, *icount, id, optbuf, 0, 0);
    }
    
    /* add an empty line */
    add_menu_txt(*items, *size, *icount, "", MI_TEXT);
    
    return i;
}